

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  Colour colourGuard;
  string local_30;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    colourGuard.m_moved = false;
    Colour::use(Cyan);
    std::operator<<(this->stream,"  ");
    poVar1 = this->stream;
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_30,this->result);
    std::operator<<(poVar1,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::operator<<(this->stream,"\n");
    Colour::~Colour(&colourGuard);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    Colour colourGuard( Colour::OriginalExpression );
                    stream  << "  ";
                    stream << result.getExpressionInMacro();
                    stream << "\n";
                }
            }